

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cpp
# Opt level: O0

bool ReadFD(MemFile *file,shared_ptr<Disk> *disk)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *path;
  element_type *peVar4;
  Data *data;
  Format local_1c0;
  Format local_184;
  Format local_148;
  Format local_10c;
  Format local_d0;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5c [8];
  Format fmt;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  fmt._52_8_ = disk;
  Format::Format((Format *)local_5c);
  path = MemFile::name_abi_cxx11_(file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"fd",&local_81);
  bVar1 = IsFileExt(path,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iVar2 = MemFile::size(file);
    if (iVar2 == 0x14000) {
      Format::Format(&local_1c0,TO_80K_FM);
      memcpy(local_5c,&local_1c0,0x3a);
    }
    else if (iVar2 == 0x28000) {
      if (opt.encoding == FM) {
        Format::Format(&local_148,TO_160K_FM);
        memcpy(local_5c,&local_148,0x3a);
      }
      else {
        Format::Format(&local_184,TO_160K_MFM);
        memcpy(local_5c,&local_184,0x3a);
      }
    }
    else if (iVar2 == 0x50000) {
      Format::Format(&local_10c,TO_320K_MFM);
      memcpy(local_5c,&local_10c,0x3a);
    }
    else {
      if (iVar2 != 0xa0000) {
        return false;
      }
      Format::Format(&local_d0,TO_640K_MFM);
      memcpy(local_5c,&local_d0,0x3a);
    }
    iVar2 = Format::disk_size((Format *)local_5c);
    iVar3 = MemFile::size(file);
    if (iVar2 != iVar3) {
      __assert_fail("fmt.disk_size() == file.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/fd.cpp"
                    ,0x2e,"bool ReadFD(MemFile &, std::shared_ptr<Disk> &)");
    }
    peVar4 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        fmt._52_8_);
    data = MemFile::data(file);
    Disk::format(peVar4,(Format *)local_5c,data,(bool)(fmt.head1._1_1_ & 1));
    peVar4 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        fmt._52_8_);
    std::__cxx11::string::operator=((string *)&peVar4->strType,"FD");
    file_local._7_1_ = true;
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool ReadFD(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmt;

    if (!IsFileExt(file.name(), "fd"))
        return false;

    switch (file.size())
    {
    case 655360:
        fmt = RegularFormat::TO_640K_MFM;
        break;

    case 327680:
        fmt = RegularFormat::TO_320K_MFM;
        break;

    case 163840:
        if (opt.encoding == Encoding::FM)
            fmt = RegularFormat::TO_160K_FM;
        else
            fmt = RegularFormat::TO_160K_MFM;
        break;

    case 81920:
        fmt = RegularFormat::TO_80K_FM;
        break;

    default:
        return false;
    }

    assert(fmt.disk_size() == file.size());
    disk->format(fmt, file.data(), fmt.cyls_first);
    disk->strType = "FD";
    return true;
}